

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokCVCCheck(btok_cvc_t *cvc)

{
  bool_t bVar1;
  err_t eVar2;
  octet *in_RDI;
  size_t in_stack_00000150;
  octet *in_stack_00000158;
  octet *in_stack_ffffffffffffffe8;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x128);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = btokCVCNameIsValid((char *)in_RDI);
    if ((bVar1 != 0) && (bVar1 = btokCVCNameIsValid((char *)in_RDI), bVar1 != 0)) {
      bVar1 = tmDateIsValid2(in_RDI);
      if ((bVar1 != 0) &&
         ((bVar1 = tmDateIsValid2(in_RDI), bVar1 != 0 &&
          (bVar1 = tmDateLeq2(in_RDI,in_stack_ffffffffffffffe8), bVar1 != 0)))) {
        eVar2 = btokPubkeyVal(in_stack_00000158,in_stack_00000150);
        return eVar2;
      }
      return 0x134;
    }
    local_4 = 0x135;
  }
  return local_4;
}

Assistant:

err_t btokCVCCheck(const btok_cvc_t* cvc)
{
	if (!memIsValid(cvc, sizeof(btok_cvc_t)))
		return ERR_BAD_INPUT;
	if (!btokCVCNameIsValid(cvc->authority) || !btokCVCNameIsValid(cvc->holder))
		return ERR_BAD_NAME;
	if (!tmDateIsValid2(cvc->from) || !tmDateIsValid2(cvc->until) ||
		!tmDateLeq2(cvc->from, cvc->until))
		return ERR_BAD_DATE;
	return btokPubkeyVal(cvc->pubkey, cvc->pubkey_len);
}